

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

void BinarySource_get_rsa_ssh1_pub(BinarySource *src,RSAKey *rsa,RsaSsh1Order order)

{
  unsigned_long uVar1;
  mp_int *pmVar2;
  mp_int *x;
  size_t sVar3;
  mp_int *x_00;
  
  uVar1 = BinarySource_get_uint32(src->binarysource_);
  pmVar2 = BinarySource_get_mp_ssh1(src->binarysource_);
  x = BinarySource_get_mp_ssh1(src->binarysource_);
  x_00 = pmVar2;
  if (order == RSA_SSH1_EXPONENT_FIRST) {
    x_00 = x;
    x = pmVar2;
  }
  if (rsa == (RSAKey *)0x0) {
    mp_free(x);
    mp_free(x_00);
    return;
  }
  rsa->bits = (int)uVar1;
  rsa->exponent = x;
  rsa->modulus = x_00;
  sVar3 = mp_get_nbits(x_00);
  rsa->bytes = (int)(sVar3 + 7 >> 3);
  return;
}

Assistant:

void BinarySource_get_rsa_ssh1_pub(
    BinarySource *src, RSAKey *rsa, RsaSsh1Order order)
{
    unsigned bits;
    mp_int *e, *m;

    bits = get_uint32(src);
    if (order == RSA_SSH1_EXPONENT_FIRST) {
        e = get_mp_ssh1(src);
        m = get_mp_ssh1(src);
    } else {
        m = get_mp_ssh1(src);
        e = get_mp_ssh1(src);
    }

    if (rsa) {
        rsa->bits = bits;
        rsa->exponent = e;
        rsa->modulus = m;
        rsa->bytes = (mp_get_nbits(m) + 7) / 8;
    } else {
        mp_free(e);
        mp_free(m);
    }
}